

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

void vkt::texture::util::wrapCubemapCorner
               (IVec2 *coord,IVec2 *size,int faceNdx,int *adjacentFace1,int *adjacentFace2,
               IVec2 *cornerCoord0,IVec2 *cornerCoord1,IVec2 *cornerCoord2)

{
  int iVar1;
  long lVar2;
  int ndx;
  long lVar3;
  int edgeNdx;
  long lVar4;
  IVec2 cornerFactor;
  int cornerEdges [2];
  int faceCorners [3];
  int local_78 [2];
  undefined8 local_68;
  Vector<int,_2> local_60;
  IVec2 *cornerCoords [3];
  Vector<int,_2> local_38;
  
  if (coord->m_data[0] < 0) {
    if (coord->m_data[1] < 0) {
      cornerEdges[0] = 0;
      goto LAB_0078e501;
    }
  }
  else if (coord->m_data[0] != 0) {
    if (coord->m_data[1] < 0) {
      cornerEdges[0] = 1;
      goto LAB_0078e501;
    }
    if (coord->m_data[1] != 0) {
      cornerEdges[0] = 2;
      goto LAB_0078e501;
    }
  }
  cornerEdges[0] = 3;
LAB_0078e501:
  cornerEdges[1] = cornerEdges[0] - 1U & 3;
  faceCorners[0] = cornerEdges[0];
  faceCorners[1] = 0;
  faceCorners[2] = 0;
  lVar3 = (long)faceNdx * 0x10;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    lVar2 = (long)cornerEdges[lVar4];
    iVar1 = *(int *)((anonymous_namespace)::adjacentEdges + lVar2 * 4 + lVar3);
    if ((*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar2 * 4 + lVar3) == -1) !=
        (1 < iVar1 != 1 < lVar2)) {
      iVar1 = (iVar1 + 1) % 4;
    }
    faceCorners[lVar4 + 1] = iVar1;
  }
  *adjacentFace1 =
       *(int *)((anonymous_namespace)::adjacentFaces + (ulong)(uint)cornerEdges[0] * 4 + lVar3);
  *adjacentFace2 =
       *(int *)((anonymous_namespace)::adjacentFaces + (ulong)(uint)cornerEdges[1] * 4 + lVar3);
  cornerCoords[0] = cornerCoord0;
  cornerCoords[1] = cornerCoord1;
  cornerCoords[2] = cornerCoord2;
  iVar1 = faceCorners[faceNdx];
  local_78[0] = 1;
  local_78[1] = 1;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    cornerFactor.m_data[0] = 0;
    cornerFactor.m_data[1] = 0;
    switch(iVar1) {
    case 0:
      cornerFactor.m_data[0] = 0;
      cornerFactor.m_data[1] = 0;
      break;
    case 1:
      cornerFactor.m_data[0] = 1;
      cornerFactor.m_data[1] = 0;
      break;
    case 2:
      cornerFactor.m_data = local_78;
      break;
    case 3:
      cornerFactor.m_data[0] = 0;
      cornerFactor.m_data[1] = 1;
    }
    local_60.m_data[0] = 1;
    local_60.m_data[1] = 1;
    tcu::operator-(size,&local_60);
    tcu::operator*(&cornerFactor,&local_38);
    *(undefined8 *)cornerCoords[lVar3]->m_data = local_68;
  }
  return;
}

Assistant:

void wrapCubemapCorner (const IVec2&	coord,
						const IVec2&	size,
						const int		faceNdx,
						int&			adjacentFace1,
						int&			adjacentFace2,
						IVec2&			cornerCoord0,
						IVec2&			cornerCoord1,
						IVec2&			cornerCoord2)
{
	int cornerNdx = -1;

	if (coord[0] < 0 && coord[1] < 0)
	{
		cornerNdx = 0;
	}
	else if (coord[0] > 0 && coord[1] < 0)
	{
		cornerNdx = 1;
	}
	else if (coord[0] > 0 && coord[1] > 0)
	{
		cornerNdx = 2;
	}
	else
	{
		cornerNdx = 3;
	}

	const int cornerEdges[2] = {cornerNdx, (int) ((cornerNdx + 3) % 4)};

	int		  faceCorners[3] = {cornerNdx, 0, 0};

	for (int edgeNdx = 0; edgeNdx < 2; ++edgeNdx)
	{
		const int faceEdge = adjacentEdges[faceNdx][cornerEdges[edgeNdx]];

		bool isFlipped = (adjacentEdgeDirs[faceNdx][cornerEdges[edgeNdx]] == -1);

		if ((cornerEdges[edgeNdx] > 1) != (faceEdge > 1))
		{
			isFlipped = !isFlipped;
		}

		if (isFlipped)
		{
			faceCorners[edgeNdx + 1] = (faceEdge + 1) % 4;
		}
		else
		{
			faceCorners[edgeNdx + 1] = faceEdge;
		}
	}

	adjacentFace1 = adjacentFaces[faceNdx][cornerEdges[0]];
	adjacentFace2 = adjacentFaces[faceNdx][cornerEdges[1]];

	IVec2* cornerCoords[3] = {&cornerCoord0, &cornerCoord1, &cornerCoord2};

	for (int ndx = 0; ndx < 3; ++ndx)
	{
		IVec2 cornerFactor;

		switch (faceCorners[faceNdx])
		{
			case 0:
				cornerFactor = IVec2(0, 0);
				break;

			case 1:
				cornerFactor = IVec2(1, 0);
				break;

			case 2:
				cornerFactor = IVec2(1, 1);
				break;

			case 3:
				cornerFactor = IVec2(0, 1);
				break;

			default:
				break;
		}

	    *cornerCoords[ndx] = cornerFactor * (size - IVec2(1));
	}
}